

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

vector_type * __thiscall
Disa::Vector_Dense<double,2ul>::operator-=
          (Vector_Dense<double,2ul> *this,Vector_Dense<double,_0UL> *vector)

{
  double dVar1;
  source_location *location;
  ostream *poVar2;
  size_type __val;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_118;
  unsigned_long index;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  vector<double,_std::allocator<double>_> *local_18;
  Vector_Dense<double,_0UL> *vector_local;
  Vector_Dense<double,_2UL> *this_local;
  
  local_18 = &vector->super_vector<double,_std::allocator<double>_>;
  vector_local = (Vector_Dense<double,_0UL> *)this;
  location = (source_location *)
             std::vector<double,_std::allocator<double>_>::size
                       (&vector->super_vector<double,_std::allocator<double>_>);
  if (location != (source_location *)0x2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001edf48;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar2 = std::operator<<(poVar2,(string *)&local_38);
    std::__cxx11::to_string(&local_f0,2);
    std::operator+(&local_d0,"Incompatible vector sizes, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    __val = std::vector<double,_std::allocator<double>_>::size(local_18);
    std::__cxx11::to_string((string *)&index,__val);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
    std::operator+(&local_70,&local_90,".");
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&index);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  for (local_118 = 0; local_118 < 2; local_118 = local_118 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,local_118);
    dVar1 = *pvVar3;
    pvVar4 = std::array<double,_2UL>::operator[]((array<double,_2UL> *)this,local_118);
    *pvVar4 = *pvVar4 - dVar1;
  }
  return (vector_type *)this;
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(_size == vector.size(),
                 "Incompatible vector sizes, " + std::to_string(_size) + " vs. " + std::to_string(vector.size()) + ".");
    FOR(index, _size)(*this)[index] -= vector[index];
    return *this;
  }